

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  RegularExpressionMatch *this_00;
  bool bVar1;
  ImportInfo *pIVar2;
  char *string;
  Names local_258;
  allocator<char> local_191;
  string_view local_190;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  undefined1 local_110 [8];
  string fileName;
  string frameworkName;
  RegularExpressionMatch match;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    pIVar2 = GetImportInfo(this,config);
    if (pIVar2 == (ImportInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_191);
      std::allocator<char>::~allocator(&local_191);
    }
    else if ((pIVar2->NoSOName & 1U) == 0) {
      bVar1 = IsFrameworkOnApple(this);
      if (bVar1) {
        cmsys::RegularExpressionMatch::RegularExpressionMatch
                  ((RegularExpressionMatch *)((long)&frameworkName.field_2 + 8));
        string = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                           string,(RegularExpressionMatch *)((long)&frameworkName.field_2 + 8));
        if (bVar1) {
          this_00 = (RegularExpressionMatch *)((long)&frameworkName.field_2 + 8);
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    ((string *)((long)&fileName.field_2 + 8),this_00,2);
          cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)local_110,this_00,3);
          cmAlphaNum::cmAlphaNum(&local_150,(string *)((long)&fileName.field_2 + 8));
          cmAlphaNum::cmAlphaNum(&local_180,".framework/");
          cmStrCat<std::__cxx11::string>
                    (__return_storage_ptr__,&local_150,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
          ;
          std::__cxx11::string::~string((string *)local_110);
          std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
          return __return_storage_ptr__;
        }
      }
      local_190 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&pIVar2->SOName);
      bVar1 = cmHasLiteralPrefix<8ul>(local_190,(char (*) [8])"@rpath/");
      if (bVar1) {
        cmStrLen<8ul>((char (*) [8])"@rpath/");
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&pIVar2->SOName);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar2->SOName);
      }
    }
    else {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar2->Location);
    }
  }
  else {
    GetLibraryNames(&local_258,this,config);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_258.SharedObject)
    ;
    Names::~Names(&local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (this->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(info->SOName.c_str(), match)) {
          auto frameworkName = match.match(2);
          auto fileName = match.match(3);
          return cmStrCat(frameworkName, ".framework/", fileName);
        }
      }
      if (cmHasLiteralPrefix(info->SOName, "@rpath/")) {
        return info->SOName.substr(cmStrLen("@rpath/"));
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}